

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O0

void gray_init_cells(gray_PWorker worker,void *buffer,long byte_size)

{
  long byte_size_local;
  void *buffer_local;
  gray_PWorker worker_local;
  
  worker->buffer = buffer;
  worker->buffer_size = byte_size;
  worker->ycells = (PCell_conflict *)buffer;
  worker->cells = (PCell_conflict)0x0;
  worker->max_cells = 0;
  worker->num_cells = 0;
  worker->area = 0;
  worker->cover = 0;
  worker->invalid = 1;
  worker->bound_left = 0x7fffffff;
  worker->bound_top = 0x7fffffff;
  worker->bound_right = -0x80000000;
  worker->bound_bottom = -0x80000000;
  return;
}

Assistant:

static void gray_init_cells(RAS_ARG_ void* buffer, long byte_size)
{
    ras.buffer = buffer;
    ras.buffer_size = byte_size;

    ras.ycells = (PCell*)buffer;
    ras.cells = NULL;
    ras.max_cells = 0;
    ras.num_cells = 0;
    ras.area = 0;
    ras.cover = 0;
    ras.invalid = 1;

    ras.bound_left = INT_MAX;
    ras.bound_top = INT_MAX;
    ras.bound_right = INT_MIN;
    ras.bound_bottom = INT_MIN;
}